

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

parser_error parse_prefs_message(parser *p)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *__s;
  size_t sVar4;
  parser_error pVar5;
  
  pcVar3 = (char *)parser_priv(p);
  if (pcVar3 != (char *)0x0) {
    pVar5 = PARSE_ERROR_NONE;
    if (*pcVar3 == '\0') {
      pcVar3 = parser_getsym(p,"type");
      __s = parser_getsym(p,"attr");
      iVar1 = message_lookup_by_name(pcVar3);
      if (iVar1 < 0) {
        pVar5 = PARSE_ERROR_INVALID_MESSAGE;
      }
      else {
        sVar4 = strlen(__s);
        if (sVar4 < 2) {
          iVar2 = color_char_to_attr(*__s);
        }
        else {
          iVar2 = color_text_to_attr(__s);
        }
        if (iVar2 < 0) {
          pVar5 = PARSE_ERROR_INVALID_COLOR;
        }
        else {
          message_color_define((uint16_t)iVar1,(uint8_t)iVar2);
        }
      }
    }
    return pVar5;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                ,0x3dc,"enum parser_error parse_prefs_message(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_message(struct parser *p)
{
	int a, msg_index;
	const char *attr;
	const char *type;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	type = parser_getsym(p, "type");
	attr = parser_getsym(p, "attr");

	msg_index = message_lookup_by_name(type);

	if (msg_index < 0)
		return PARSE_ERROR_INVALID_MESSAGE;

	if (strlen(attr) > 1)
		a = color_text_to_attr(attr);
	else
		a = color_char_to_attr(attr[0]);

	if (a < 0)
		return PARSE_ERROR_INVALID_COLOR;

	message_color_define(msg_index, (uint8_t)a);

	return PARSE_ERROR_NONE;
}